

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolution3DLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  WeightParamType WVar5;
  LayerUnion LVar6;
  long *plVar7;
  undefined8 *puVar8;
  int iVar9;
  size_type *psVar10;
  int iVar11;
  undefined8 uVar12;
  WeightParams *pWVar13;
  _Alloc_hider _Var14;
  string err_7;
  Result r;
  string err;
  string local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  WeightParamType local_11c;
  int32 local_118;
  int local_114;
  uint64_t local_110;
  int32 local_104;
  int32 local_100;
  int local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_190);
  validateInputCount((Result *)local_168,layer,1,1);
  local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168;
  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
  pcVar2 = local_158 + 8;
  if (local_160._M_p != pcVar2) {
    operator_delete(local_160._M_p,local_158._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_190);
  if (bVar3) {
    validateOutputCount((Result *)local_168,layer,1,1);
    local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168;
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
    if (local_160._M_p != pcVar2) {
      operator_delete(local_160._M_p,local_158._8_8_ + 1);
    }
    bVar3 = Result::good((Result *)&local_190);
    if (bVar3) {
      if (this->ndArrayInterpretation == true) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Convolution3D","");
        validateInputOutputRankEquality((Result *)local_168,layer,&local_d0,&this->blobNameToRank);
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168;
        std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
        if (local_160._M_p != pcVar2) {
          operator_delete(local_160._M_p,local_158._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Result::good((Result *)&local_190);
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Convolution3D","");
          validateRankCount((Result *)local_168,layer,&local_1b0,5,-1,&this->blobNameToRank);
          local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168;
          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
          if (local_160._M_p != pcVar2) {
            operator_delete(local_160._M_p,local_158._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Result::good((Result *)&local_190);
          if (bVar3) goto LAB_002c53d2;
        }
      }
      else {
LAB_002c53d2:
        if (layer->_oneof_case_[0] == 0x5bf) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.convolution3d_ = Specification::Convolution3DLayerParams::default_instance();
        }
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
          std::operator+(&local_1b0,"Convolution3D layer: \'",(layer->name_).ptr_);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_168 = (undefined1  [8])local_158;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_158._0_8_ = *psVar10;
            local_158._8_8_ = plVar7[3];
          }
          else {
            local_158._0_8_ = *psVar10;
            local_168 = (undefined1  [8])*plVar7;
          }
          local_160._M_p = (pointer)plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_168);
          goto LAB_002c5ca3;
        }
        iVar9 = (LVar6.pooling_)->type_;
        local_118 = ((LVar6.convolution_)->dilationfactor_).current_size_;
        local_110 = (uint64_t)(LVar6.convolution_)->_stride_cached_byte_size_;
        paVar1 = &local_1b0.field_2;
        local_1b0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Input Channels","");
        local_114 = iVar9;
        validatePositive((Result *)local_168,iVar9,&local_1b0);
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168;
        std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
        if (local_160._M_p != pcVar2) {
          operator_delete(local_160._M_p,local_158._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Result::good((Result *)&local_190);
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Output Channels","")
          ;
          validatePositive((Result *)local_168,(int)local_110,&local_1b0);
          local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168;
          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
          if (local_160._M_p != pcVar2) {
            operator_delete(local_160._M_p,local_158._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Result::good((Result *)&local_190);
          if (bVar3) {
            local_1b0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Groups","");
            validatePositive((Result *)local_168,local_118,&local_1b0);
            local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168;
            std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
            if (local_160._M_p != pcVar2) {
              operator_delete(local_160._M_p,local_158._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            bVar3 = Result::good((Result *)&local_190);
            if (bVar3) {
              iVar9 = ((LVar6.convolution_)->dilationfactor_).total_size_;
              local_100 = *(int32 *)&((LVar6.convolution_)->dilationfactor_).rep_;
              local_104 = *(int32 *)((long)&((LVar6.convolution_)->dilationfactor_).rep_ + 4);
              local_1b0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"Kernel Depth","");
              local_fc = iVar9;
              validatePositive((Result *)local_168,iVar9,&local_1b0);
              local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168;
              std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
              if (local_160._M_p != pcVar2) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != paVar1) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              bVar3 = Result::good((Result *)&local_190);
              if (bVar3) {
                local_1b0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b0,"Kernel Height","");
                validatePositive((Result *)local_168,local_100,&local_1b0);
                local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_168;
                std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                if (local_160._M_p != pcVar2) {
                  operator_delete(local_160._M_p,local_158._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                bVar3 = Result::good((Result *)&local_190);
                if (bVar3) {
                  local_1b0._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1b0,"Kernel Width","");
                  validatePositive((Result *)local_168,local_104,&local_1b0);
                  local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_168;
                  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                  if (local_160._M_p != pcVar2) {
                    operator_delete(local_160._M_p,local_158._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = Result::good((Result *)&local_190);
                  if (bVar3) {
                    iVar9 = (LVar6.convolution_)->_dilationfactor_cached_byte_size_;
                    local_1b0._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b0,"Stride Depth","");
                    validatePositive((Result *)local_168,iVar9,&local_1b0);
                    local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_168;
                    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                    if (local_160._M_p != pcVar2) {
                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b0._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1b0._M_dataplus._M_p,
                                      local_1b0.field_2._M_allocated_capacity + 1);
                    }
                    bVar3 = Result::good((Result *)&local_190);
                    if (bVar3) {
                      iVar9 = (LVar6.scale_)->_cached_size_;
                      local_1b0._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1b0,"Stride Height","");
                      validatePositive((Result *)local_168,iVar9,&local_1b0);
                      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_168;
                      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                      if (local_160._M_p != pcVar2) {
                        operator_delete(local_160._M_p,local_158._8_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_1b0._M_dataplus._M_p,
                                        local_1b0.field_2._M_allocated_capacity + 1);
                      }
                      bVar3 = Result::good((Result *)&local_190);
                      if (bVar3) {
                        iVar9 = ((LVar6.convolution_)->outputshape_).current_size_;
                        local_1b0._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1b0,"Stride Width","");
                        validatePositive((Result *)local_168,iVar9,&local_1b0);
                        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_168;
                        std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                        if (local_160._M_p != pcVar2) {
                          operator_delete(local_160._M_p,local_158._8_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1b0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_1b0._M_dataplus._M_p,
                                          local_1b0.field_2._M_allocated_capacity + 1);
                        }
                        bVar3 = Result::good((Result *)&local_190);
                        if (bVar3) {
                          iVar9 = ((LVar6.convolution_)->outputshape_).total_size_;
                          local_1b0._M_dataplus._M_p = (pointer)paVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1b0,"Dilation Depth","");
                          validatePositive((Result *)local_168,iVar9,&local_1b0);
                          local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168;
                          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160)
                          ;
                          if (local_160._M_p != pcVar2) {
                            operator_delete(local_160._M_p,local_158._8_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1b0._M_dataplus._M_p != paVar1) {
                            operator_delete(local_1b0._M_dataplus._M_p,
                                            local_1b0.field_2._M_allocated_capacity + 1);
                          }
                          bVar3 = Result::good((Result *)&local_190);
                          if (bVar3) {
                            iVar9 = *(int *)&((LVar6.convolution_)->outputshape_).rep_;
                            local_1b0._M_dataplus._M_p = (pointer)paVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1b0,"Dilation Height","");
                            validatePositive((Result *)local_168,iVar9,&local_1b0);
                            local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_168;
                            std::__cxx11::string::operator=
                                      ((string *)&local_188,(string *)&local_160);
                            if (local_160._M_p != pcVar2) {
                              operator_delete(local_160._M_p,local_158._8_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                              operator_delete(local_1b0._M_dataplus._M_p,
                                              local_1b0.field_2._M_allocated_capacity + 1);
                            }
                            bVar3 = Result::good((Result *)&local_190);
                            if (bVar3) {
                              iVar9 = *(int32 *)((long)&((LVar6.convolution_)->outputshape_).rep_ +
                                                4);
                              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1b0,"Dilation Width","");
                              validatePositive((Result *)local_168,iVar9,&local_1b0);
                              local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_168;
                              std::__cxx11::string::operator=
                                        ((string *)&local_188,(string *)&local_160);
                              if (local_160._M_p != pcVar2) {
                                operator_delete(local_160._M_p,local_158._8_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                operator_delete(local_1b0._M_dataplus._M_p,
                                                local_1b0.field_2._M_allocated_capacity + 1);
                              }
                              bVar3 = Result::good((Result *)&local_190);
                              if (bVar3) {
                                if ((LVar6.bidirectionallstm_)->_cached_size_ < 0) {
                                  std::__cxx11::to_string
                                            (&local_140,(LVar6.bidirectionallstm_)->_cached_size_);
                                  std::operator+(&local_1b0,
                                                 "Custom Padding Front must be non-negative, got \'"
                                                 ,&local_140);
                                  puVar8 = (undefined8 *)
                                           std::__cxx11::string::append((char *)&local_1b0);
                                  local_168 = (undefined1  [8])local_158;
                                  psVar10 = puVar8 + 2;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*puVar8 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar10) {
                                    local_158._0_8_ = *psVar10;
                                    local_158._8_8_ = puVar8[3];
                                  }
                                  else {
                                    local_158._0_8_ = *psVar10;
                                    local_168 = (undefined1  [8])*puVar8;
                                  }
                                  local_160._M_p = (pointer)puVar8[1];
                                  *puVar8 = psVar10;
                                  puVar8[1] = 0;
                                  *(undefined1 *)(puVar8 + 2) = 0;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                    operator_delete(local_1b0._M_dataplus._M_p,
                                                    local_1b0.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                    operator_delete(local_140._M_dataplus._M_p,
                                                    local_140.field_2._M_allocated_capacity + 1);
                                  }
                                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                 (string *)local_168);
LAB_002c5ca3:
                                  uVar12 = local_158._0_8_;
                                  _Var14._M_p = (pointer)local_168;
                                  if (local_168 == (undefined1  [8])local_158) goto LAB_002c665f;
                                }
                                else {
                                  iVar9 = ((LVar6.slicestatic_)->strides_).total_size_;
                                  if (iVar9 < 0) {
                                    std::__cxx11::to_string(&local_140,iVar9);
                                    std::operator+(&local_1b0,
                                                                                                      
                                                  "Custom Padding Back must be non-negative, got \'"
                                                  ,&local_140);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1b0);
                                    local_168 = (undefined1  [8])local_158;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_168);
                                    goto LAB_002c5ca3;
                                  }
                                  iVar9 = *(int *)&((LVar6.slicestatic_)->strides_).rep_;
                                  if (iVar9 < 0) {
                                    std::__cxx11::to_string(&local_140,iVar9);
                                    std::operator+(&local_1b0,
                                                   "Custom Padding Top must be non-negative, got \'"
                                                   ,&local_140);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1b0);
                                    local_168 = (undefined1  [8])local_158;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_168);
                                    goto LAB_002c5ca3;
                                  }
                                  iVar9 = *(int32 *)((long)&((LVar6.slicestatic_)->strides_).rep_ +
                                                    4);
                                  if (iVar9 < 0) {
                                    std::__cxx11::to_string(&local_140,iVar9);
                                    std::operator+(&local_1b0,
                                                                                                      
                                                  "Custom Padding Bottom must be non-negative, got \'"
                                                  ,&local_140);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1b0);
                                    local_168 = (undefined1  [8])local_158;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_168);
                                    goto LAB_002c5ca3;
                                  }
                                  if ((LVar6.slicestatic_)->_strides_cached_byte_size_ < 0) {
                                    std::__cxx11::to_string
                                              (&local_140,
                                               (LVar6.slicestatic_)->_strides_cached_byte_size_);
                                    std::operator+(&local_1b0,
                                                   "customPadding Left must be non-negative, got \'"
                                                   ,&local_140);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1b0);
                                    local_168 = (undefined1  [8])local_158;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_168);
                                    goto LAB_002c5ca3;
                                  }
                                  if ((LVar6.gru_)->_cached_size_ < 0) {
                                    std::__cxx11::to_string(&local_140,(LVar6.gru_)->_cached_size_);
                                    std::operator+(&local_1b0,
                                                                                                      
                                                  "customPadding Right must be non-negative, got \'"
                                                  ,&local_140);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_1b0);
                                    local_168 = (undefined1  [8])local_158;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   (string *)local_168);
                                    goto LAB_002c5ca3;
                                  }
                                  pWVar13 = (LVar6.batchnorm_)->variance_;
                                  if (pWVar13 == (WeightParams *)0x0) {
                                    pWVar13 = (WeightParams *)
                                              &Specification::_WeightParams_default_instance_;
                                  }
                                  WVar5 = valueType(pWVar13);
                                  pWVar13 = (LVar6.gru_)->resetgateweightmatrix_;
                                  if (pWVar13 == (WeightParams *)0x0) {
                                    pWVar13 = (WeightParams *)
                                              &Specification::_WeightParams_default_instance_;
                                  }
                                  local_11c = valueType(pWVar13);
                                  if ((WVar5 == UNSPECIFIED) ||
                                     (bVar3 = (LVar6.convolution3d_)->hasbias_,
                                     (local_11c == UNSPECIFIED & bVar3) != 0)) {
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_168,"Convolution3D layer \'",
                                                  (layer->name_).ptr_);
                                    puVar8 = (undefined8 *)std::__cxx11::string::append(local_168);
                                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0.field_2._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0._M_dataplus._M_p = (pointer)*puVar8;
                                    }
                                    local_1b0._M_string_length = puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if (local_168 != (undefined1  [8])local_158) {
                                      operator_delete((void *)local_168,local_158._0_8_ + 1);
                                    }
                                    Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                   &local_1b0);
                                    goto LAB_002c62d1;
                                  }
                                  if ((bVar3 != false) &&
                                     (((WVar5 == FLOAT16 && (local_11c == FLOAT32)) ||
                                      ((WVar5 == FLOAT32 && (local_11c == FLOAT16)))))) {
                                    std::operator+(&local_140,"Convolution3D layer \'",
                                                   (layer->name_).ptr_);
                                    plVar7 = (long *)std::__cxx11::string::append
                                                               ((char *)&local_140);
                                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                    psVar10 = (size_type *)(plVar7 + 2);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar7 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0.field_2._8_8_ = plVar7[3];
                                    }
                                    else {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0._M_dataplus._M_p = (pointer)*plVar7;
                                    }
                                    local_1b0._M_string_length = plVar7[1];
                                    *plVar7 = (long)psVar10;
                                    plVar7[1] = 0;
                                    *(undefined1 *)(plVar7 + 2) = 0;
                                    Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                   &local_1b0);
                                    local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_168;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_188,(string *)&local_160);
                                    if (local_160._M_p != pcVar2) {
                                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
LAB_002c65fc:
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    goto LAB_002c6611;
                                  }
                                  iVar9 = ((LVar6.convolution_)->kernelsize_).current_size_;
                                  if (iVar9 != 0) {
                                    if ((LVar6.convolution3d_)->isdeconvolution_ == false) {
                                      std::operator+(&local_1b0,"Deconvolution3D Layer \'",
                                                     (layer->name_).ptr_);
                                      puVar8 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_1b0);
                                      local_168 = (undefined1  [8])local_158;
                                      psVar10 = puVar8 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_158._0_8_ = *psVar10;
                                        local_158._8_8_ = puVar8[3];
                                      }
                                      else {
                                        local_158._0_8_ = *psVar10;
                                        local_168 = (undefined1  [8])*puVar8;
                                      }
                                      local_160._M_p = (pointer)puVar8[1];
                                      *puVar8 = psVar10;
                                      puVar8[1] = 0;
                                      *(undefined1 *)(puVar8 + 2) = 0;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                        operator_delete(local_1b0._M_dataplus._M_p,
                                                        local_1b0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,(string *)local_168);
                                    }
                                    else {
                                      if (iVar9 == 3) goto LAB_002c61ae;
                                      std::operator+(&local_1b0,"Deconvolution3D layer: \'",
                                                     (layer->name_).ptr_);
                                      puVar8 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_1b0);
                                      local_168 = (undefined1  [8])local_158;
                                      psVar10 = puVar8 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_158._0_8_ = *psVar10;
                                        local_158._8_8_ = puVar8[3];
                                      }
                                      else {
                                        local_158._0_8_ = *psVar10;
                                        local_168 = (undefined1  [8])*puVar8;
                                      }
                                      local_160._M_p = (pointer)puVar8[1];
                                      *puVar8 = psVar10;
                                      puVar8[1] = 0;
                                      *(undefined1 *)(puVar8 + 2) = 0;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                        operator_delete(local_1b0._M_dataplus._M_p,
                                                        local_1b0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,(string *)local_168);
                                    }
                                    goto LAB_002c5ca3;
                                  }
LAB_002c61ae:
                                  if (WVar5 == QUINT) {
                                    std::operator+(&local_140,"Layer \'",(layer->name_).ptr_);
                                    puVar8 = (undefined8 *)
                                             std::__cxx11::string::append((char *)&local_140);
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_158._0_8_ = *psVar10;
                                      local_158._8_8_ = puVar8[3];
                                      local_168 = (undefined1  [8])local_158;
                                    }
                                    else {
                                      local_158._0_8_ = *psVar10;
                                      local_168 = (undefined1  [8])*puVar8;
                                    }
                                    local_160._M_p = (pointer)puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    puVar8 = (undefined8 *)std::__cxx11::string::append(local_168);
                                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                    psVar10 = puVar8 + 2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*puVar8 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar10) {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0.field_2._8_8_ = puVar8[3];
                                    }
                                    else {
                                      local_1b0.field_2._M_allocated_capacity = *psVar10;
                                      local_1b0._M_dataplus._M_p = (pointer)*puVar8;
                                    }
                                    local_1b0._M_string_length = puVar8[1];
                                    *puVar8 = psVar10;
                                    puVar8[1] = 0;
                                    *(undefined1 *)(puVar8 + 2) = 0;
                                    if (local_168 != (undefined1  [8])local_158) {
                                      operator_delete((void *)local_168,local_158._0_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                   &local_1b0);
                                  }
                                  else {
                                    iVar9 = (int)local_110;
                                    iVar11 = local_114;
                                    if ((LVar6.convolution3d_)->isdeconvolution_ == false) {
                                      iVar11 = iVar9;
                                      iVar9 = local_114;
                                    }
                                    local_118 = iVar9 / local_118;
                                    pWVar13 = (LVar6.batchnorm_)->variance_;
                                    if (pWVar13 == (WeightParams *)0x0) {
                                      pWVar13 = (WeightParams *)
                                                &Specification::_WeightParams_default_instance_;
                                    }
                                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                    local_114 = iVar11;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1b0,"Convolution3D ","");
                                    local_d8 = (layer->name_).ptr_;
                                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_140,"weights","");
                                    validateGeneralWeightParams
                                              ((Result *)local_168,pWVar13,
                                               (long)(local_100 * local_fc * local_104 *
                                                     local_118 * local_114),local_110,&local_1b0,
                                               local_d8,&local_140);
                                    local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_168;
                                    std::__cxx11::string::operator=
                                              ((string *)&local_188,(string *)&local_160);
                                    if (local_160._M_p != pcVar2) {
                                      operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                      operator_delete(local_140._M_dataplus._M_p,
                                                      local_140.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                      operator_delete(local_1b0._M_dataplus._M_p,
                                                      local_1b0.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar4 = Result::good((Result *)&local_190);
                                    if ((!bVar4) || (bVar3 == false)) goto LAB_002c6611;
                                    if (local_11c < QUINT) {
                                      pWVar13 = (LVar6.gru_)->resetgateweightmatrix_;
                                      if (pWVar13 == (WeightParams *)0x0) {
                                        pWVar13 = (WeightParams *)
                                                  &Specification::_WeightParams_default_instance_;
                                      }
                                      if (local_11c == FLOAT32) {
                                        iVar9 = (pWVar13->floatvalue_).current_size_;
                                      }
                                      else {
                                        iVar9 = (int)(((pWVar13->float16value_).ptr_)->
                                                      _M_string_length >> 1);
                                      }
                                      if (iVar9 == (int)local_110) goto LAB_002c6611;
                                      std::operator+(&local_70,"Convolution3D layer \'",
                                                     (layer->name_).ptr_);
                                      plVar7 = (long *)std::__cxx11::string::append
                                                                 ((char *)&local_70);
                                      psVar10 = (size_type *)(plVar7 + 2);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*plVar7 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_f8.field_2._M_allocated_capacity = *psVar10;
                                        local_f8.field_2._8_8_ = plVar7[3];
                                        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                                      }
                                      else {
                                        local_f8.field_2._M_allocated_capacity = *psVar10;
                                        local_f8._M_dataplus._M_p = (pointer)*plVar7;
                                      }
                                      local_f8._M_string_length = plVar7[1];
                                      *plVar7 = (long)psVar10;
                                      plVar7[1] = 0;
                                      *(undefined1 *)(plVar7 + 2) = 0;
                                      std::__cxx11::to_string(&local_90,iVar9);
                                      std::operator+(&local_50,&local_f8,&local_90);
                                      plVar7 = (long *)std::__cxx11::string::append
                                                                 ((char *)&local_50);
                                      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                                      psVar10 = (size_type *)(plVar7 + 2);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*plVar7 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_140.field_2._M_allocated_capacity = *psVar10;
                                        local_140.field_2._8_8_ = plVar7[3];
                                      }
                                      else {
                                        local_140.field_2._M_allocated_capacity = *psVar10;
                                        local_140._M_dataplus._M_p = (pointer)*plVar7;
                                      }
                                      local_140._M_string_length = plVar7[1];
                                      *plVar7 = (long)psVar10;
                                      plVar7[1] = 0;
                                      *(undefined1 *)(plVar7 + 2) = 0;
                                      std::__cxx11::to_string(&local_b0,(int)local_110);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_168,&local_140,&local_b0);
                                      puVar8 = (undefined8 *)std::__cxx11::string::append(local_168)
                                      ;
                                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                      psVar10 = puVar8 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_1b0.field_2._M_allocated_capacity = *psVar10;
                                        local_1b0.field_2._8_8_ = puVar8[3];
                                      }
                                      else {
                                        local_1b0.field_2._M_allocated_capacity = *psVar10;
                                        local_1b0._M_dataplus._M_p = (pointer)*puVar8;
                                      }
                                      local_1b0._M_string_length = puVar8[1];
                                      *puVar8 = psVar10;
                                      puVar8[1] = 0;
                                      *(undefined1 *)(puVar8 + 2) = 0;
                                      if (local_168 != (undefined1  [8])local_158) {
                                        operator_delete((void *)local_168,local_158._0_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                                        operator_delete(local_b0._M_dataplus._M_p,
                                                        local_b0.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                        operator_delete(local_140._M_dataplus._M_p,
                                                        local_140.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                        operator_delete(local_50._M_dataplus._M_p,
                                                        local_50.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                        operator_delete(local_90._M_dataplus._M_p,
                                                        local_90.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                                        operator_delete(local_f8._M_dataplus._M_p,
                                                        local_f8.field_2._M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                                        operator_delete(local_70._M_dataplus._M_p,
                                                        local_70.field_2._M_allocated_capacity + 1);
                                      }
                                      Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                     &local_1b0);
                                    }
                                    else {
                                      if (local_11c != QUINT) {
                                        std::operator+(&local_140,"Layer ",(layer->name_).ptr_);
                                        puVar8 = (undefined8 *)
                                                 std::__cxx11::string::append((char *)&local_140);
                                        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                        psVar10 = puVar8 + 2;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)*puVar8 ==
                                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)psVar10) {
                                          local_1b0.field_2._M_allocated_capacity = *psVar10;
                                          local_1b0.field_2._8_8_ = puVar8[3];
                                        }
                                        else {
                                          local_1b0.field_2._M_allocated_capacity = *psVar10;
                                          local_1b0._M_dataplus._M_p = (pointer)*puVar8;
                                        }
                                        local_1b0._M_string_length = puVar8[1];
                                        *puVar8 = psVar10;
                                        puVar8[1] = 0;
                                        *(undefined1 *)(puVar8 + 2) = 0;
                                        Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                       &local_1b0);
                                        local_190 = (
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_168;
                                        std::__cxx11::string::operator=
                                                  ((string *)&local_188,(string *)&local_160);
                                        if (local_160._M_p != pcVar2) {
                                          operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                          operator_delete(local_1b0._M_dataplus._M_p,
                                                          local_1b0.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        goto LAB_002c65fc;
                                      }
                                      std::operator+(&local_140,"Layer \'",(layer->name_).ptr_);
                                      puVar8 = (undefined8 *)
                                               std::__cxx11::string::append((char *)&local_140);
                                      psVar10 = puVar8 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_158._0_8_ = *psVar10;
                                        local_158._8_8_ = puVar8[3];
                                        local_168 = (undefined1  [8])local_158;
                                      }
                                      else {
                                        local_158._0_8_ = *psVar10;
                                        local_168 = (undefined1  [8])*puVar8;
                                      }
                                      local_160._M_p = (pointer)puVar8[1];
                                      *puVar8 = psVar10;
                                      puVar8[1] = 0;
                                      *(undefined1 *)(puVar8 + 2) = 0;
                                      puVar8 = (undefined8 *)std::__cxx11::string::append(local_168)
                                      ;
                                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                                      psVar10 = puVar8 + 2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*puVar8 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar10) {
                                        local_1b0.field_2._M_allocated_capacity = *psVar10;
                                        local_1b0.field_2._8_8_ = puVar8[3];
                                      }
                                      else {
                                        local_1b0.field_2._M_allocated_capacity = *psVar10;
                                        local_1b0._M_dataplus._M_p = (pointer)*puVar8;
                                      }
                                      local_1b0._M_string_length = puVar8[1];
                                      *puVar8 = psVar10;
                                      puVar8[1] = 0;
                                      *(undefined1 *)(puVar8 + 2) = 0;
                                      if (local_168 != (undefined1  [8])local_158) {
                                        operator_delete((void *)local_168,local_158._0_8_ + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_140._M_dataplus._M_p != &local_140.field_2) {
                                        operator_delete(local_140._M_dataplus._M_p,
                                                        local_140.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      Result::Result((Result *)local_168,INVALID_MODEL_PARAMETERS,
                                                     &local_1b0);
                                    }
                                  }
LAB_002c62d1:
                                  local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_168;
                                  std::__cxx11::string::operator=
                                            ((string *)&local_188,(string *)&local_160);
                                  if (local_160._M_p != pcVar2) {
                                    operator_delete(local_160._M_p,local_158._8_8_ + 1);
                                  }
                                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    **)__return_storage_ptr__ = local_190;
                                  paVar1 = &(__return_storage_ptr__->m_message).field_2;
                                  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
                                       (pointer)paVar1;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_p == &local_178) {
                                    paVar1->_M_allocated_capacity =
                                         CONCAT71(local_178._M_allocated_capacity._1_7_,
                                                  local_178._M_local_buf[0]);
                                    *(undefined8 *)
                                     ((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                                         local_178._8_8_;
                                  }
                                  else {
                                    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
                                         local_188._M_p;
                                    (__return_storage_ptr__->m_message).field_2.
                                    _M_allocated_capacity =
                                         CONCAT71(local_178._M_allocated_capacity._1_7_,
                                                  local_178._M_local_buf[0]);
                                  }
                                  (__return_storage_ptr__->m_message)._M_string_length = local_180;
                                  local_180 = 0;
                                  local_178._M_local_buf[0] = '\0';
                                  uVar12 = local_1b0.field_2._M_allocated_capacity;
                                  _Var14._M_p = local_1b0._M_dataplus._M_p;
                                  local_188._M_p = (pointer)&local_178;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1b0._M_dataplus._M_p == &local_1b0.field_2)
                                  goto LAB_002c665f;
                                }
                                operator_delete(_Var14._M_p,uVar12 + 1);
                                goto LAB_002c665f;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_002c6611:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_190;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p == &local_178) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_178._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_188._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_180;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
LAB_002c665f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != &local_178) {
    operator_delete(local_188._M_p,
                    CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolution3DLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution3D", blobNameToRank);
        if (!r.good()) { return r; }
        r = validateRankCount(layer, "Convolution3D", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }

    const auto& params = layer.convolution3d();

    if (layer.input_size() != 1) {
        std::string err = "Convolution3D layer: '" + layer.name() +
            "', convolution3D does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Validate input and output channels and number of convolution groups are positive
    int inputChannels = params.inputchannels();
    int outputChannels = params.outputchannels();
    int nGroups = params.ngroups();
    r = validatePositive(inputChannels, "Input Channels");
    if (!r.good()) { return r; }
    r = validatePositive(outputChannels, "Output Channels");
    if (!r.good()) { return r; }
    r = validatePositive(nGroups, "Groups");
    if (!r.good()) { return r; }

    // Validate kernel is positive
    int kernelDepth = params.kerneldepth();
    int kernelHeight = params.kernelheight();
    int kernelWidth = params.kernelwidth();
    r = validatePositive(kernelDepth, "Kernel Depth");
    if (!r.good()) { return r; }
    r = validatePositive(kernelHeight, "Kernel Height");
    if (!r.good()) { return r; }
    r = validatePositive(kernelWidth, "Kernel Width");
    if (!r.good()) { return r; }

    // Validate stride is positive
    r = validatePositive(params.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }

    // Validate dilation is positive
    r = validatePositive(params.dilationdepth(), "Dilation Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationheight(), "Dilation Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationwidth(), "Dilation Width");
    if (!r.good()) { return r; }

    // Validate padding
    int customPaddingFront = params.custompaddingfront();
    int customPaddingBack = params.custompaddingback();
    int customPaddingTop = params.custompaddingtop();
    int customPaddingBottom = params.custompaddingbottom();
    int customPaddingLeft = params.custompaddingleft();
    int customPaddingRight = params.custompaddingright();
    if (customPaddingFront < 0) {
        std::string err = "Custom Padding Front must be non-negative, got '" +
            std::to_string(customPaddingFront) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBack < 0) {
        std::string err = "Custom Padding Back must be non-negative, got '" +
            std::to_string(customPaddingBack) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingTop < 0) {
        std::string err = "Custom Padding Top must be non-negative, got '" +
            std::to_string(customPaddingTop) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBottom < 0) {
        std::string err = "Custom Padding Bottom must be non-negative, got '" +
            std::to_string(customPaddingBottom) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingLeft < 0) {
        std::string err = "customPadding Left must be non-negative, got '" +
            std::to_string(customPaddingLeft) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingRight < 0) {
        std::string err = "customPadding Right must be non-negative, got '" +
            std::to_string(customPaddingRight) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());
    bool has_bias = params.hasbias();

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution3D layer '" + layer.name() +
            "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution3D layer '" + layer.name() +
                "' has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    bool is_deconv = params.isdeconvolution();

    if (params.outputshape_size() != 0) {
        if (!is_deconv) {
            std::string err = "Deconvolution3D Layer '" + layer.name() + "' Output Shape is supported for Deconvolution layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else if (params.outputshape_size() != 3) {
            std::string err = "Deconvolution3D layer: '" + layer.name() + "' , if set, output shape must be of length 3.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    // Manually check if weights are quantized--we don't currently support them and
    // `validateGeneralWeightParams` allows them
    if (weightsValueType == QUINT) {
        std::string err = "Layer '" + layer.name() + "' has invalid weights field. Quantized " +
            "weights are not supported.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    uint64_t expected_weight_size = 0;
    if (is_deconv) {
        expected_weight_size = static_cast<uint64_t>((outputChannels / nGroups) * inputChannels * kernelDepth * kernelHeight * kernelWidth);
    } else {
        expected_weight_size = static_cast<uint64_t>(outputChannels * (inputChannels / nGroups) * kernelDepth * kernelHeight * kernelWidth);
    }
    r = validateGeneralWeightParams(params.weights(), expected_weight_size, uint64_t(outputChannels),
                                    "Convolution3D ", layer.name(), "weights");
    if (!r.good()) { return r; }

    // Check the bias
    int bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = params.bias().floatvalue().size();
            } else {
                bias_size = int(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution3D layer '" + layer.name() +
                    "' has a bias vector of size " + std::to_string(bias_size) + " but should be " +
                    std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // We don't currently support quantized parameters.
            std::string err = "Layer '" + layer.name() + "' has invalid bias field. Quantized " +
                "bias is not supported.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() +
                "has not specified bias.");
            return r;
        }
    }
    return r;
}